

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qframe.cpp
# Opt level: O0

int __thiscall QFrame::qt_metacall(QFrame *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int unaff_retaddr;
  Call unaff_retaddr_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = QWidget::qt_metacall
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (Call)((ulong)in_RDI >> 0x20),(int)in_RDI,(void **)CONCAT44(in_ESI,in_EDX));
  if ((-1 < iVar1) &&
     ((((in_ESI == 1 || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))))) {
    qt_static_metacall((QObject *)_a,unaff_retaddr_00,unaff_retaddr,
                       (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    iVar1 = iVar1 + -6;
  }
  return iVar1;
}

Assistant:

int QFrame::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 6;
    }
    return _id;
}